

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::GLMClassifier::MergePartialFromCodedStream
          (GLMClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  Type *this_00;
  Int64Vector *pIVar7;
  StringVector *pSVar8;
  pair<int,_int> pVar9;
  char cVar10;
  uint uVar11;
  int byte_limit;
  int iVar12;
  ulong uVar13;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar13 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar11, (~(uint)*pbVar1 & uVar11) < 0x80))
        goto LAB_001f6632;
        uVar13 = (ulong)((uVar11 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar13 = uVar13 | 0x100000000;
    }
    else {
LAB_001f6632:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar13 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar6 | uVar13;
    }
    uVar6 = (uint32)uVar13;
    if ((uVar13 & 0x100000000) == 0) {
LAB_001f6329:
      iVar12 = 7;
      if ((uVar6 & 7) == 4 || uVar6 == 0) goto LAB_001f6356;
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_001f634b:
      if (bVar5 == false) {
        iVar12 = 6;
        goto LAB_001f6356;
      }
      goto LAB_001f6353;
    }
    uVar11 = (uint)(uVar13 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar13;
    switch(uVar11) {
    case 1:
      if (cVar10 != '\n') goto LAB_001f6329;
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                          (&(this->weights_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      iVar12 = 6;
      if (bVar5) {
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,byte_limit);
        if (((long)pVar9 < 0) ||
           (bVar5 = GLMClassifier_DoubleArray::MergePartialFromCodedStream(this_00,input), !bVar5))
        goto LAB_001f65fe;
        bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar9.first);
LAB_001f65e8:
        iVar12 = 6;
        if (bVar5 != false) goto LAB_001f6353;
      }
      break;
    case 2:
      if (cVar10 == '\x11') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,0x12,input,&this->offset_);
      }
      else {
        if ((uVar6 & 0xff) != 0x12) goto LAB_001f6329;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&this->offset_);
      }
      goto LAB_001f634b;
    case 3:
      if (cVar10 != '\x18') goto LAB_001f6329;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar13 = (ulong)bVar2;
        uVar6 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001f6663;
        input->buffer_ = pbVar3 + 1;
        bVar5 = true;
      }
      else {
        uVar6 = 0;
LAB_001f6663:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar5 = -1 < (long)uVar13;
      }
      if (!bVar5) goto LAB_001f66bd;
      this->postevaluationtransform_ = (int)uVar13;
LAB_001f66ad:
      iVar12 = 0;
      goto LAB_001f66b0;
    case 4:
      if (cVar10 != ' ') goto LAB_001f6329;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar13 = (ulong)bVar2;
        uVar6 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001f668a;
        input->buffer_ = pbVar3 + 1;
        bVar5 = true;
      }
      else {
        uVar6 = 0;
LAB_001f668a:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar5 = -1 < (long)uVar13;
      }
      if (bVar5) {
        this->classencoding_ = (int)uVar13;
        goto LAB_001f66ad;
      }
LAB_001f66bd:
      iVar12 = 6;
LAB_001f66b0:
      if (bVar5) {
LAB_001f6353:
        iVar12 = 0;
      }
      break;
    default:
      if (uVar11 == 100) {
        if (cVar10 != '\"') goto LAB_001f6329;
        if (this->_oneof_case_[0] != 100) {
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 100;
          pSVar8 = (StringVector *)operator_new(0x30);
          StringVector::StringVector(pSVar8);
          (this->ClassLabels_).stringclasslabels_ = pSVar8;
        }
        pSVar8 = (this->ClassLabels_).stringclasslabels_;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar12 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
          input->buffer_ = puVar4 + 1;
          bVar5 = true;
        }
        else {
          iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar5 = -1 < iVar12;
        }
        if ((bVar5) &&
           (pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar12), -1 < (long)pVar9)) {
          bVar5 = StringVector::MergePartialFromCodedStream(pSVar8,input);
          goto LAB_001f65d4;
        }
      }
      else {
        if ((uVar11 != 0x65) || (cVar10 != '*')) goto LAB_001f6329;
        if (this->_oneof_case_[0] != 0x65) {
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 0x65;
          pIVar7 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(pIVar7);
          (this->ClassLabels_).int64classlabels_ = pIVar7;
        }
        pIVar7 = (this->ClassLabels_).int64classlabels_;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar12 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
          input->buffer_ = puVar4 + 1;
          bVar5 = true;
        }
        else {
          iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar5 = -1 < iVar12;
        }
        if ((bVar5) &&
           (pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar12), -1 < (long)pVar9)) {
          bVar5 = Int64Vector::MergePartialFromCodedStream(pIVar7,input);
LAB_001f65d4:
          if (bVar5 != false) {
            bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar9.first);
            goto LAB_001f65e8;
          }
        }
      }
LAB_001f65fe:
      iVar12 = 6;
    }
LAB_001f6356:
    if (iVar12 != 0) {
      return iVar12 != 6;
    }
  } while( true );
}

Assistant:

bool GLMClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GLMClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double offset = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_offset())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(17u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 18u, input, this->mutable_offset())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::GLMClassifier_PostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_classencoding(static_cast< ::CoreML::Specification::GLMClassifier_ClassEncoding >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GLMClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GLMClassifier)
  return false;
#undef DO_
}